

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.h
# Opt level: O2

LinkedToken * __thiscall Linker::getLinkedToken(Linker *this,Token *token)

{
  LinkedToken *pLVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  format_string_t<const_std::__cxx11::basic_string<char>_&> fmt;
  format_string_t<const_std::__cxx11::basic_string<char>_&> fmt_00;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(const_LinkedToken_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/linker/Linker.h:20:41)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(const_LinkedToken_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/linker/Linker.h:20:41)>
             ::_M_manager;
  local_38._M_unused._M_object = token;
  pLVar1 = Cache<LinkedToken>::find
                     (&this->tokenCache,(function<bool_(const_LinkedToken_&)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  if (pLVar1 == (LinkedToken *)0x0) {
    fmt_00.str_.size_ = (size_t)token;
    fmt_00.str_.data_ = (char *)0x22;
    spdlog::info<std::__cxx11::string_const&>
              ((spdlog *)"\'{}\' not in cache, starting search",fmt_00,in_RCX);
    pLVar1 = searchForLink(this,token);
  }
  else {
    fmt.str_.size_ = (size_t)token;
    fmt.str_.data_ = (char *)0x13;
    spdlog::info<std::__cxx11::string_const&>((spdlog *)"Found \'{}\' in cache",fmt,in_RCX);
  }
  return pLVar1;
}

Assistant:

LinkedToken* getLinkedToken(const Token& token) {
			LinkedToken* entry = tokenCache.find([&](const LinkedToken& linkedToken) {
				return linkedToken == token;
			});

			if (entry != nullptr) {
				spdlog::info("Found '{}' in cache", token.content);
			} else {
				spdlog::info("'{}' not in cache, starting search", token.content);
				entry = searchForLink(token);
			}
			return entry;
		}